

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralMatrixVector.h
# Opt level: O1

void Eigen::internal::
     general_matrix_vector_product<long,_double,_Eigen::internal::const_blas_data_mapper<double,_long,_1>,_1,_false,_double,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_false,_0>
     ::run(long rows,long cols,const_blas_data_mapper<double,_long,_1> *lhs,
          const_blas_data_mapper<double,_long,_0> *rhs,ResScalar *res,long resIncr,ResScalar alpha)

{
  double dVar1;
  double *pdVar2;
  double *pdVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  double *pdVar12;
  double *pdVar13;
  ulong uVar14;
  bool bVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double *local_98;
  double *local_90;
  ulong local_88;
  
  pdVar2 = (rhs->super_blas_data_mapper<const_double,_long,_0,_0>).m_data;
  uVar8 = 0xffffffffffffffff;
  if ((((ulong)pdVar2 & 7) == 0) &&
     (uVar8 = (ulong)((uint)((ulong)pdVar2 >> 3) & 1), cols <= (long)uVar8)) {
    uVar8 = cols;
  }
  pdVar3 = (lhs->super_blas_data_mapper<const_double,_long,_1,_0>).m_data;
  uVar6 = 0xffffffffffffffff;
  if ((((ulong)pdVar3 & 7) == 0) &&
     (uVar6 = (ulong)((uint)((ulong)pdVar3 >> 3) & 1), cols <= (long)uVar6)) {
    uVar6 = cols;
  }
  uVar14 = 0xffffffffffffffff;
  if ((((ulong)pdVar2 & 7) == 0) &&
     (uVar14 = (ulong)((uint)((ulong)pdVar2 >> 3) & 1), rows <= (long)uVar14)) {
    uVar14 = rows;
  }
  lVar4 = (lhs->super_blas_data_mapper<const_double,_long,_1,_0>).m_stride;
  local_88 = 3;
  if (((((long)uVar6 < 0) || (uVar14 == rows)) || (uVar6 == cols)) || ((long)uVar14 < 0)) {
    lVar9 = 0;
    uVar8 = 0;
    lVar11 = 0;
  }
  else {
    uVar14 = (ulong)((uint)lVar4 & 1);
    lVar9 = (cols - uVar8 & 0xfffffffffffffffe) + uVar8;
    lVar11 = 0;
    do {
      if (uVar8 == ((uint)uVar6 & 1)) goto LAB_0010e8a3;
      lVar11 = lVar11 + 1;
      uVar6 = uVar6 + lVar4;
    } while (lVar11 == 1);
    lVar11 = 2;
LAB_0010e8a3:
    if (lVar11 == 2) {
      lVar11 = 0;
    }
    else {
      local_88 = uVar14;
      if (rows <= lVar11) {
        lVar11 = rows;
      }
    }
  }
  uVar14 = rows - lVar11;
  uVar6 = uVar14 + 3;
  if (-1 < (long)uVar14) {
    uVar6 = uVar14;
  }
  lVar7 = (uVar6 & 0xfffffffffffffffc) + lVar11;
  if (3 < (long)uVar14) {
    local_90 = pdVar3 + (lVar11 + 3) * lVar4 + lVar9;
    pdVar13 = pdVar3 + (lVar11 + 2) * lVar4 + lVar9;
    local_98 = pdVar3 + (lVar11 + 1) * lVar4 + lVar9;
    pdVar12 = pdVar3 + lVar11 * lVar4 + lVar9;
    lVar5 = lVar11;
    do {
      dVar18 = 0.0;
      dVar19 = 0.0;
      dVar17 = 0.0;
      dVar16 = 0.0;
      if (0 < (long)uVar8) {
        dVar18 = *pdVar2;
        dVar16 = pdVar3[(lVar5 + 3) * lVar4] * dVar18 + 0.0;
        dVar17 = pdVar3[(lVar5 + 2) * lVar4] * dVar18 + 0.0;
        dVar19 = pdVar3[(lVar5 + 1) * lVar4] * dVar18 + 0.0;
        dVar18 = dVar18 * pdVar3[lVar5 * lVar4] + 0.0;
      }
      if ((long)uVar8 < lVar9) {
        (*(code *)(&DAT_00118200 + *(int *)(&DAT_00118200 + local_88 * 4)))();
        return;
      }
      if (lVar9 < cols) {
        lVar10 = 0;
        do {
          dVar1 = pdVar2[lVar9 + lVar10];
          dVar18 = dVar18 + pdVar12[lVar10] * dVar1;
          dVar19 = dVar19 + local_98[lVar10] * dVar1;
          dVar17 = dVar17 + pdVar13[lVar10] * dVar1;
          dVar16 = dVar16 + dVar1 * local_90[lVar10];
          lVar10 = lVar10 + 1;
        } while (cols - lVar9 != lVar10);
      }
      res[lVar5 * resIncr] = dVar18 * alpha + res[lVar5 * resIncr];
      lVar10 = (lVar5 + 1) * resIncr;
      res[lVar10] = dVar19 * alpha + res[lVar10];
      lVar10 = (lVar5 + 2) * resIncr;
      res[lVar10] = dVar17 * alpha + res[lVar10];
      lVar10 = (lVar5 + 3) * resIncr;
      res[lVar10] = dVar16 * alpha + res[lVar10];
      lVar5 = lVar5 + 4;
      local_90 = local_90 + lVar4 * 4;
      pdVar13 = pdVar13 + lVar4 * 4;
      local_98 = local_98 + lVar4 * 4;
      pdVar12 = pdVar12 + lVar4 * 4;
    } while (lVar5 < lVar7);
  }
  do {
    if (lVar7 < rows) {
      pdVar12 = (double *)(lVar4 * 8 * lVar7 + (long)pdVar3);
      do {
        if ((long)uVar8 < 1) {
          dVar16 = 0.0;
        }
        else {
          dVar16 = pdVar3[lVar7 * lVar4] * *pdVar2 + 0.0;
        }
        if ((long)uVar8 < lVar9) {
          dVar17 = 0.0;
          dVar18 = 0.0;
          uVar6 = uVar8;
          if (((int)(pdVar3 + lVar7 * lVar4) + (int)uVar8 * 8 & 0xfU) == 0) {
            for (; (long)uVar6 < lVar9; uVar6 = uVar6 + 2) {
              dVar17 = dVar17 + pdVar12[uVar6] * pdVar2[uVar6];
              dVar18 = dVar18 + (pdVar12 + uVar6)[1] * (pdVar2 + uVar6)[1];
            }
          }
          else {
            for (; (long)uVar6 < lVar9; uVar6 = uVar6 + 2) {
              dVar17 = dVar17 + pdVar12[uVar6] * pdVar2[uVar6];
              dVar18 = dVar18 + (pdVar12 + uVar6)[1] * (pdVar2 + uVar6)[1];
            }
          }
          dVar16 = dVar16 + dVar18 + dVar17;
        }
        lVar5 = lVar9;
        if (lVar9 < cols) {
          do {
            dVar16 = dVar16 + pdVar12[lVar5] * pdVar2[lVar5];
            lVar5 = lVar5 + 1;
          } while (cols != lVar5);
        }
        res[lVar7 * resIncr] = dVar16 * alpha + res[lVar7 * resIncr];
        lVar7 = lVar7 + 1;
        pdVar12 = pdVar12 + lVar4;
      } while (lVar7 != rows);
    }
    lVar7 = 0;
    bVar15 = lVar11 != 0;
    rows = lVar11;
    lVar11 = 0;
  } while (bVar15);
  return;
}

Assistant:

EIGEN_DONT_INLINE void general_matrix_vector_product<Index,LhsScalar,LhsMapper,RowMajor,ConjugateLhs,RhsScalar,RhsMapper,ConjugateRhs,Version>::run(
  Index rows, Index cols,
  const LhsMapper& lhs,
  const RhsMapper& rhs,
  ResScalar* res, Index resIncr,
  ResScalar alpha)
{
  eigen_internal_assert(rhs.stride()==1);

  #ifdef _EIGEN_ACCUMULATE_PACKETS
  #error _EIGEN_ACCUMULATE_PACKETS has already been defined
  #endif

  #define _EIGEN_ACCUMULATE_PACKETS(Alignment0,Alignment13,Alignment2) {\
    RhsPacket b = rhs.getVectorMapper(j, 0).template load<RhsPacket, Aligned>(0);  \
    ptmp0 = pcj.pmadd(lhs0.template load<LhsPacket, Alignment0>(j), b, ptmp0); \
    ptmp1 = pcj.pmadd(lhs1.template load<LhsPacket, Alignment13>(j), b, ptmp1); \
    ptmp2 = pcj.pmadd(lhs2.template load<LhsPacket, Alignment2>(j), b, ptmp2); \
    ptmp3 = pcj.pmadd(lhs3.template load<LhsPacket, Alignment13>(j), b, ptmp3); }

  conj_helper<LhsScalar,RhsScalar,ConjugateLhs,ConjugateRhs> cj;
  conj_helper<LhsPacket,RhsPacket,ConjugateLhs,ConjugateRhs> pcj;

  typedef typename LhsMapper::VectorMapper LhsScalars;

  enum { AllAligned=0, EvenAligned=1, FirstAligned=2, NoneAligned=3 };
  const Index rowsAtOnce = 4;
  const Index peels = 2;
  const Index RhsPacketAlignedMask = RhsPacketSize-1;
  const Index LhsPacketAlignedMask = LhsPacketSize-1;
  const Index depth = cols;
  const Index lhsStride = lhs.stride();

  // How many coeffs of the result do we have to skip to be aligned.
  // Here we assume data are at least aligned on the base scalar type
  // if that's not the case then vectorization is discarded, see below.
  Index alignedStart = rhs.firstAligned(depth);
  Index alignedSize = RhsPacketSize>1 ? alignedStart + ((depth-alignedStart) & ~RhsPacketAlignedMask) : 0;
  const Index peeledSize = alignedSize - RhsPacketSize*peels - RhsPacketSize + 1;

  const Index alignmentStep = LhsPacketSize>1 ? (LhsPacketSize - lhsStride % LhsPacketSize) & LhsPacketAlignedMask : 0;
  Index alignmentPattern = alignmentStep==0 ? AllAligned
                           : alignmentStep==(LhsPacketSize/2) ? EvenAligned
                           : FirstAligned;

  // we cannot assume the first element is aligned because of sub-matrices
  const Index lhsAlignmentOffset = lhs.firstAligned(depth);
  const Index rhsAlignmentOffset = rhs.firstAligned(rows);

  // find how many rows do we have to skip to be aligned with rhs (if possible)
  Index skipRows = 0;
  // if the data cannot be aligned (TODO add some compile time tests when possible, e.g. for floats)
  if( (sizeof(LhsScalar)!=sizeof(RhsScalar)) ||
      (lhsAlignmentOffset < 0) || (lhsAlignmentOffset == depth) ||
      (rhsAlignmentOffset < 0) || (rhsAlignmentOffset == rows) )
  {
    alignedSize = 0;
    alignedStart = 0;
    alignmentPattern = NoneAligned;
  }
  else if(LhsPacketSize > 4)
  {
    // TODO: extend the code to support aligned loads whenever possible when LhsPacketSize > 4.
    alignmentPattern = NoneAligned;
  }
  else if (LhsPacketSize>1)
  {
  //    eigen_internal_assert(size_t(firstLhs+lhsAlignmentOffset)%sizeof(LhsPacket)==0  || depth<LhsPacketSize);

    while (skipRows<LhsPacketSize &&
           alignedStart != ((lhsAlignmentOffset + alignmentStep*skipRows)%LhsPacketSize))
      ++skipRows;
    if (skipRows==LhsPacketSize)
    {
      // nothing can be aligned, no need to skip any column
      alignmentPattern = NoneAligned;
      skipRows = 0;
    }
    else
    {
      skipRows = (std::min)(skipRows,Index(rows));
      // note that the skiped columns are processed later.
    }
    /*    eigen_internal_assert(  alignmentPattern==NoneAligned
                      || LhsPacketSize==1
                      || (skipRows + rowsAtOnce >= rows)
                      || LhsPacketSize > depth
                      || (size_t(firstLhs+alignedStart+lhsStride*skipRows)%sizeof(LhsPacket))==0);*/
  }
  else if(Vectorizable)
  {
    alignedStart = 0;
    alignedSize = depth;
    alignmentPattern = AllAligned;
  }

  const Index offset1 = (alignmentPattern==FirstAligned && alignmentStep==1)?3:1;
  const Index offset3 = (alignmentPattern==FirstAligned && alignmentStep==1)?1:3;

  Index rowBound = ((rows-skipRows)/rowsAtOnce)*rowsAtOnce + skipRows;
  for (Index i=skipRows; i<rowBound; i+=rowsAtOnce)
  {
    // FIXME: what is the purpose of this EIGEN_ALIGN_DEFAULT ??
    EIGEN_ALIGN_MAX ResScalar tmp0 = ResScalar(0);
    ResScalar tmp1 = ResScalar(0), tmp2 = ResScalar(0), tmp3 = ResScalar(0);

    // this helps the compiler generating good binary code
    const LhsScalars lhs0 = lhs.getVectorMapper(i+0, 0),    lhs1 = lhs.getVectorMapper(i+offset1, 0),
                     lhs2 = lhs.getVectorMapper(i+2, 0),    lhs3 = lhs.getVectorMapper(i+offset3, 0);

    if (Vectorizable)
    {
      /* explicit vectorization */
      ResPacket ptmp0 = pset1<ResPacket>(ResScalar(0)), ptmp1 = pset1<ResPacket>(ResScalar(0)),
                ptmp2 = pset1<ResPacket>(ResScalar(0)), ptmp3 = pset1<ResPacket>(ResScalar(0));

      // process initial unaligned coeffs
      // FIXME this loop get vectorized by the compiler !
      for (Index j=0; j<alignedStart; ++j)
      {
        RhsScalar b = rhs(j, 0);
        tmp0 += cj.pmul(lhs0(j),b); tmp1 += cj.pmul(lhs1(j),b);
        tmp2 += cj.pmul(lhs2(j),b); tmp3 += cj.pmul(lhs3(j),b);
      }

      if (alignedSize>alignedStart)
      {
        switch(alignmentPattern)
        {
          case AllAligned:
            for (Index j = alignedStart; j<alignedSize; j+=RhsPacketSize)
              _EIGEN_ACCUMULATE_PACKETS(Aligned,Aligned,Aligned);
            break;
          case EvenAligned:
            for (Index j = alignedStart; j<alignedSize; j+=RhsPacketSize)
              _EIGEN_ACCUMULATE_PACKETS(Aligned,Unaligned,Aligned);
            break;
          case FirstAligned:
          {
            Index j = alignedStart;
            if (peels>1)
            {
              /* Here we proccess 4 rows with with two peeled iterations to hide
               * the overhead of unaligned loads. Moreover unaligned loads are handled
               * using special shift/move operations between the two aligned packets
               * overlaping the desired unaligned packet. This is *much* more efficient
               * than basic unaligned loads.
               */
              LhsPacket A01, A02, A03, A11, A12, A13;
              A01 = lhs1.template load<LhsPacket, Aligned>(alignedStart-1);
              A02 = lhs2.template load<LhsPacket, Aligned>(alignedStart-2);
              A03 = lhs3.template load<LhsPacket, Aligned>(alignedStart-3);

              for (; j<peeledSize; j+=peels*RhsPacketSize)
              {
                RhsPacket b = rhs.getVectorMapper(j, 0).template load<RhsPacket, Aligned>(0);
                A11 = lhs1.template load<LhsPacket, Aligned>(j-1+LhsPacketSize);  palign<1>(A01,A11);
                A12 = lhs2.template load<LhsPacket, Aligned>(j-2+LhsPacketSize);  palign<2>(A02,A12);
                A13 = lhs3.template load<LhsPacket, Aligned>(j-3+LhsPacketSize);  palign<3>(A03,A13);

                ptmp0 = pcj.pmadd(lhs0.template load<LhsPacket, Aligned>(j), b, ptmp0);
                ptmp1 = pcj.pmadd(A01, b, ptmp1);
                A01 = lhs1.template load<LhsPacket, Aligned>(j-1+2*LhsPacketSize);  palign<1>(A11,A01);
                ptmp2 = pcj.pmadd(A02, b, ptmp2);
                A02 = lhs2.template load<LhsPacket, Aligned>(j-2+2*LhsPacketSize);  palign<2>(A12,A02);
                ptmp3 = pcj.pmadd(A03, b, ptmp3);
                A03 = lhs3.template load<LhsPacket, Aligned>(j-3+2*LhsPacketSize);  palign<3>(A13,A03);

                b = rhs.getVectorMapper(j+RhsPacketSize, 0).template load<RhsPacket, Aligned>(0);
                ptmp0 = pcj.pmadd(lhs0.template load<LhsPacket, Aligned>(j+LhsPacketSize), b, ptmp0);
                ptmp1 = pcj.pmadd(A11, b, ptmp1);
                ptmp2 = pcj.pmadd(A12, b, ptmp2);
                ptmp3 = pcj.pmadd(A13, b, ptmp3);
              }
            }
            for (; j<alignedSize; j+=RhsPacketSize)
              _EIGEN_ACCUMULATE_PACKETS(Aligned,Unaligned,Unaligned);
            break;
          }
          default:
            for (Index j = alignedStart; j<alignedSize; j+=RhsPacketSize)
              _EIGEN_ACCUMULATE_PACKETS(Unaligned,Unaligned,Unaligned);
            break;
        }
        tmp0 += predux(ptmp0);
        tmp1 += predux(ptmp1);
        tmp2 += predux(ptmp2);
        tmp3 += predux(ptmp3);
      }
    } // end explicit vectorization

    // process remaining coeffs (or all if no explicit vectorization)
    // FIXME this loop get vectorized by the compiler !
    for (Index j=alignedSize; j<depth; ++j)
    {
      RhsScalar b = rhs(j, 0);
      tmp0 += cj.pmul(lhs0(j),b); tmp1 += cj.pmul(lhs1(j),b);
      tmp2 += cj.pmul(lhs2(j),b); tmp3 += cj.pmul(lhs3(j),b);
    }
    res[i*resIncr]            += alpha*tmp0;
    res[(i+offset1)*resIncr]  += alpha*tmp1;
    res[(i+2)*resIncr]        += alpha*tmp2;
    res[(i+offset3)*resIncr]  += alpha*tmp3;
  }

  // process remaining first and last rows (at most columnsAtOnce-1)
  Index end = rows;
  Index start = rowBound;
  do
  {
    for (Index i=start; i<end; ++i)
    {
      EIGEN_ALIGN_MAX ResScalar tmp0 = ResScalar(0);
      ResPacket ptmp0 = pset1<ResPacket>(tmp0);
      const LhsScalars lhs0 = lhs.getVectorMapper(i, 0);
      // process first unaligned result's coeffs
      // FIXME this loop get vectorized by the compiler !
      for (Index j=0; j<alignedStart; ++j)
        tmp0 += cj.pmul(lhs0(j), rhs(j, 0));

      if (alignedSize>alignedStart)
      {
        // process aligned rhs coeffs
        if (lhs0.template aligned<LhsPacket>(alignedStart))
          for (Index j = alignedStart;j<alignedSize;j+=RhsPacketSize)
            ptmp0 = pcj.pmadd(lhs0.template load<LhsPacket, Aligned>(j), rhs.getVectorMapper(j, 0).template load<RhsPacket, Aligned>(0), ptmp0);
        else
          for (Index j = alignedStart;j<alignedSize;j+=RhsPacketSize)
            ptmp0 = pcj.pmadd(lhs0.template load<LhsPacket, Unaligned>(j), rhs.getVectorMapper(j, 0).template load<RhsPacket, Aligned>(0), ptmp0);
        tmp0 += predux(ptmp0);
      }

      // process remaining scalars
      // FIXME this loop get vectorized by the compiler !
      for (Index j=alignedSize; j<depth; ++j)
        tmp0 += cj.pmul(lhs0(j), rhs(j, 0));
      res[i*resIncr] += alpha*tmp0;
    }
    if (skipRows)
    {
      start = 0;
      end = skipRows;
      skipRows = 0;
    }
    else
      break;
  } while(Vectorizable);

  #undef _EIGEN_ACCUMULATE_PACKETS
}